

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

nh_roles_info * nh_get_roles(void)

{
  boolean bVar1;
  int size;
  nh_roles_info *pnVar2;
  char **ppcVar3;
  char **ppcVar4;
  nh_bool *__s;
  nh_bool *tmpmatrix;
  char **names2;
  char **names;
  nh_roles_info *info;
  int arrsize;
  int alignnum;
  int gendnum;
  int racenum;
  int rolenum;
  int i;
  
  pnVar2 = (nh_roles_info *)xmalloc(0x50);
  racenum = 0;
  while (roles[racenum].name.m != (char *)0x0) {
    racenum = racenum + 1;
  }
  pnVar2->num_roles = racenum;
  racenum = 0;
  while (races[racenum].noun != (char *)0x0) {
    racenum = racenum + 1;
  }
  pnVar2->num_races = racenum;
  pnVar2->num_genders = 2;
  pnVar2->num_aligns = 3;
  ppcVar3 = (char **)xmalloc(pnVar2->num_roles << 3);
  ppcVar4 = (char **)xmalloc(pnVar2->num_roles << 3);
  for (racenum = 0; racenum < pnVar2->num_roles; racenum = racenum + 1) {
    ppcVar3[racenum] = roles[racenum].name.m;
    ppcVar4[racenum] = roles[racenum].name.f;
  }
  pnVar2->rolenames_m = ppcVar3;
  pnVar2->rolenames_f = ppcVar4;
  ppcVar3 = (char **)xmalloc(pnVar2->num_races << 3);
  for (racenum = 0; racenum < pnVar2->num_races; racenum = racenum + 1) {
    ppcVar3[racenum] = races[racenum].noun;
  }
  pnVar2->racenames = ppcVar3;
  ppcVar3 = (char **)xmalloc(pnVar2->num_genders << 3);
  for (racenum = 0; racenum < pnVar2->num_genders; racenum = racenum + 1) {
    ppcVar3[racenum] = genders[racenum].adj;
  }
  pnVar2->gendnames = ppcVar3;
  ppcVar3 = (char **)xmalloc(pnVar2->num_aligns << 3);
  for (racenum = 0; racenum < pnVar2->num_aligns; racenum = racenum + 1) {
    ppcVar3[racenum] = aligns[racenum].adj;
  }
  pnVar2->alignnames = ppcVar3;
  pnVar2->def_role = flags.init_role;
  pnVar2->def_race = flags.init_race;
  pnVar2->def_gend = flags.init_gend;
  pnVar2->def_align = flags.init_align;
  size = pnVar2->num_roles * pnVar2->num_races * pnVar2->num_genders * pnVar2->num_aligns;
  __s = (nh_bool *)xmalloc(size);
  memset(__s,0,(long)size);
  for (gendnum = 0; gendnum < pnVar2->num_roles; gendnum = gendnum + 1) {
    for (alignnum = 0; alignnum < pnVar2->num_races; alignnum = alignnum + 1) {
      bVar1 = ok_race(gendnum,alignnum,-1,-1);
      if (bVar1 != '\0') {
        for (arrsize = 0; arrsize < pnVar2->num_genders; arrsize = arrsize + 1) {
          bVar1 = ok_gend(gendnum,alignnum,arrsize,-1);
          if (bVar1 != '\0') {
            for (info._4_4_ = 0; info._4_4_ < pnVar2->num_aligns; info._4_4_ = info._4_4_ + 1) {
              bVar1 = ok_align(gendnum,alignnum,arrsize,info._4_4_);
              __s[((gendnum * pnVar2->num_races + alignnum) * pnVar2->num_genders + arrsize) *
                  pnVar2->num_aligns + info._4_4_] = bVar1;
            }
          }
        }
      }
    }
  }
  pnVar2->matrix = __s;
  return pnVar2;
}

Assistant:

struct nh_roles_info *nh_get_roles(void)
{
	int i, rolenum, racenum, gendnum, alignnum, arrsize;
	struct nh_roles_info *info = xmalloc(sizeof(struct nh_roles_info));
	const char **names, **names2;
	nh_bool *tmpmatrix;
	
	/* number of choices */
	for (i = 0; roles[i].name.m; i++);
	info->num_roles = i;
	
	for (i = 0; races[i].noun; i++);
	info->num_races = i;
	
	info->num_genders = ROLE_GENDERS;
	info->num_aligns = ROLE_ALIGNS;
	
	/* names of choices */
	names = xmalloc(info->num_roles * sizeof(char*));
	names2 = xmalloc(info->num_roles * sizeof(char*));
	for (i = 0; i < info->num_roles; i++) {
	    names[i]  = roles[i].name.m;
	    names2[i] = roles[i].name.f;
	}
	info->rolenames_m = names;
	info->rolenames_f = names2;

	names = xmalloc(info->num_races * sizeof(char*));
	for (i = 0; i < info->num_races; i++)
	    names[i] = races[i].noun;
	info->racenames = names;
	
	names = xmalloc(info->num_genders * sizeof(char*));
	for (i = 0; i < info->num_genders; i++)
	    names[i] = genders[i].adj;
	info->gendnames = names;
	
	names = xmalloc(info->num_aligns * sizeof(char*));
	for (i = 0; i < info->num_aligns; i++)
	    names[i] = aligns[i].adj;
	info->alignnames = names;
	
	/* default choices */
	info->def_role = flags.init_role;
	info->def_race = flags.init_race;
	info->def_gend = flags.init_gend;
	info->def_align = flags.init_align;
	
	/* valid combinations of choices */
	arrsize = info->num_roles * info->num_races * info->num_genders * info->num_aligns;
	tmpmatrix = xmalloc(arrsize * sizeof(nh_bool));
	memset(tmpmatrix, FALSE, arrsize * sizeof(nh_bool));
	for (rolenum = 0; rolenum < info->num_roles; rolenum++) {
	    for (racenum = 0; racenum < info->num_races; racenum++) {
		if (!ok_race(rolenum, racenum, ROLE_NONE, ROLE_NONE))
		    continue;
		for (gendnum = 0; gendnum < info->num_genders; gendnum++) {
		    if (!ok_gend(rolenum, racenum, gendnum, ROLE_NONE))
			continue;
		    for (alignnum = 0; alignnum < info->num_aligns; alignnum++) {
			tmpmatrix[nh_cm_idx((*info), rolenum, racenum, gendnum, alignnum)] =
			    ok_align(rolenum, racenum, gendnum, alignnum);
		    }
		}
	    }
	}
	info->matrix = tmpmatrix;
	
	return info;
}